

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

void __thiscall
Problem_CGBG_FF::Problem_CGBG_FF
          (Problem_CGBG_FF *this,size_t nrHouses,size_t nrFLs,size_t nrAgents,
          size_t nrActionsPerAgent,size_t nrObservedHousesPerAgent,size_t k)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  reference pvVar4;
  reference pvVar5;
  Index agI;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  allocator_type local_ca;
  allocator_type local_c9;
  string local_c8;
  string local_a8;
  vector<Scope,_std::allocator<Scope>_> *local_88;
  vector<Scope,_std::allocator<Scope>_> *local_80;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_78;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_70;
  Scope *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  size_t local_40;
  value_type_conflict2 local_38;
  undefined1 extraout_var_01 [56];
  
  auVar10 = in_ZMM1._0_16_;
  auVar8 = in_ZMM0._0_16_;
  local_40 = nrActionsPerAgent;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,nrAgents,&local_40,
             &local_c9);
  auVar8 = vcvtusi2sd_avx512f(auVar8,nrFLs);
  auVar10 = vcvtusi2sd_avx512f(auVar10,nrObservedHousesPerAgent);
  auVar9._0_8_ = pow(auVar8._0_8_,auVar10._0_8_);
  auVar9._8_56_ = extraout_var_01;
  local_38 = vcvttsd2usi_avx512f(auVar9._0_16_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,nrAgents,&local_38,
             &local_ca);
  BayesianGameCollaborativeGraphical::BayesianGameCollaborativeGraphical
            (&this->super_BayesianGameCollaborativeGraphical,nrAgents,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8);
  local_68 = &this->_m_allAgents;
  (this->super_BayesianGameCollaborativeGraphical).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__Problem_CGBG_FF_005df090;
  (this->_m_allAgents).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_allAgents).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_allAgents).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_nrHouses = nrHouses;
  this->_m_nrFireLevels = nrFLs;
  this->_m_nrObsPerHouse = nrFLs;
  this->_m_nrActionsPerAgent = local_40;
  p_Var1 = &(this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header;
  this->_m_nrObservedHousesPerAgents = nrObservedHousesPerAgent;
  this->_m_k = k;
  this->_m_maxNrAgentsObservingAHouse = k;
  *(undefined8 *)&(this->_m_Norm_cache)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  local_80 = &this->_m_agentsForHouse_action;
  std::vector<Scope,_std::allocator<Scope>_>::vector
            (local_80,nrHouses,(value_type *)&local_c8,(allocator_type *)&local_a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8);
  local_c8.field_2._M_allocated_capacity = 0;
  local_88 = &this->_m_agentsForHouse_obs;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  std::vector<Scope,_std::allocator<Scope>_>::vector
            (local_88,nrHouses,(value_type *)&local_c8,(allocator_type *)&local_a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8);
  local_c8.field_2._M_allocated_capacity = 0;
  local_78 = &this->_m_houseIndices_obs;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(local_78,nrAgents,(value_type *)&local_c8,(allocator_type *)&local_a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8);
  local_c8.field_2._M_allocated_capacity = 0;
  local_70 = &this->_m_houseIndices_action;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(local_70,nrAgents,(value_type *)&local_c8,(allocator_type *)&local_a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8);
  local_48 = &this->_m_housePositionX;
  local_c8._M_dataplus._M_p = (pointer)0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (local_48,nrHouses,(value_type_conflict3 *)&local_c8,(allocator_type *)&local_a8);
  local_50 = &this->_m_housePositionY;
  local_c8._M_dataplus._M_p = (pointer)0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (local_50,nrHouses,(value_type_conflict3 *)&local_c8,(allocator_type *)&local_a8);
  local_58 = &this->_m_agentPositionX;
  local_c8._M_dataplus._M_p = (pointer)0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (local_58,nrAgents,(value_type_conflict3 *)&local_c8,(allocator_type *)&local_a8);
  local_60 = &this->_m_agentPositionY;
  local_c8._M_dataplus._M_p = (pointer)0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (local_60,nrAgents,(value_type_conflict3 *)&local_c8,(allocator_type *)&local_a8);
  uVar6 = 0;
  while( true ) {
    iVar2 = (*(this->super_BayesianGameCollaborativeGraphical).
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this);
    if (CONCAT44(extraout_var,iVar2) <= uVar6) break;
    Scope::Insert(local_68,(Index)uVar6);
    uVar6 = (ulong)((Index)uVar6 + 1);
  }
  ScatterHouses(this);
  ScatterAgents(this);
  AssignAgentActionsToHouses(this);
  AssignAgentTypesToHouses(this);
  poVar3 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Assignment summary:");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar7 = 0;
  while( true ) {
    iVar2 = (*(this->super_BayesianGameCollaborativeGraphical).
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this);
    uVar6 = (ulong)uVar7;
    if (CONCAT44(extraout_var_00,iVar2) <= uVar6) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"Agent ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"...\n\tcan fight fire at houses:");
    pvVar4 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(local_70,uVar6);
    PrintTools::SoftPrintVector<unsigned_int>(&local_c8,pvVar4);
    poVar3 = std::operator<<(poVar3,(string *)&local_c8);
    poVar3 = std::operator<<(poVar3,"\n\tand can observe houses:");
    pvVar4 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(local_78,uVar6);
    PrintTools::SoftPrintVector<unsigned_int>(&local_a8,pvVar4);
    poVar3 = std::operator<<(poVar3,(string *)&local_a8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    uVar7 = uVar7 + 1;
  }
  for (uVar7 = 0; uVar6 = (ulong)uVar7, uVar6 < this->_m_nrHouses; uVar7 = uVar7 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"House ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"...\n\tcan be visited by agents :");
    pvVar5 = std::vector<Scope,_std::allocator<Scope>_>::at(local_80,uVar6);
    poVar3 = ::operator<<(poVar3,pvVar5);
    poVar3 = std::operator<<(poVar3,"\n\tand by observed by agents:");
    pvVar5 = std::vector<Scope,_std::allocator<Scope>_>::at(local_88,uVar6);
    poVar3 = ::operator<<(poVar3,pvVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar6 = 0; uVar6 < this->_m_nrHouses; uVar6 = (ulong)((Index)uVar6 + 1)) {
    AddEdge(this,(Index)uVar6);
  }
  return;
}

Assistant:

Problem_CGBG_FF::Problem_CGBG_FF(
                size_t nrHouses,
                size_t nrFLs,
                size_t nrAgents,
                size_t nrActionsPerAgent,       //i.e., z
                size_t nrObservedHousesPerAgent,//i.e., y
                size_t k                        //the maximum number of agents in a house's payoff function

    )
    :
        BayesianGameCollaborativeGraphical(
                nrAgents, 
                vector<size_t>(nrAgents, nrActionsPerAgent),
#if USE_FLAMES_NOFLAMES_OBS
                vector<size_t>(nrAgents, pow(2, nrObservedHousesPerAgent))
#else
                vector<size_t>(nrAgents, pow(nrFLs, nrObservedHousesPerAgent))
#endif
                )
        ,_m_allAgents()
        ,_m_nrHouses(nrHouses)
        ,_m_nrFireLevels(nrFLs)
#if USE_FLAMES_NOFLAMES_OBS
        ,_m_nrObsPerHouse(2)
#else
        ,_m_nrObsPerHouse(nrFLs) // each firelevel is a type
#endif
        ,_m_nrActionsPerAgent(nrActionsPerAgent)
        ,_m_nrObservedHousesPerAgents(nrObservedHousesPerAgent)
        ,_m_k(k)
        //this means that there is no limit on how many agents can observe a house:
        //,_m_maxNrAgentsObservingAHouse(nrAgents)
        ,_m_maxNrAgentsObservingAHouse(k)//<-this means that there is no limit on how many agents can observe a house
        ,_m_Norm_cache()
        ,_m_agentsForHouse_action(nrHouses, Scope())
        ,_m_agentsForHouse_obs(nrHouses, Scope())
        ,_m_houseIndices_obs(nrAgents, vector<Index>() )
        ,_m_houseIndices_action(nrAgents, vector<Index>() )
        ,_m_housePositionX(nrHouses, -1.0)
        ,_m_housePositionY(nrHouses, -1.0)
        ,_m_agentPositionX(nrAgents, -1.0)
        ,_m_agentPositionY(nrAgents, -1.0)


{
    //cout << "Problem_CGBG_FF::constructor...\n";
    //cout << "nrFLs=" << nrFLs;
    //cout << "\nnrObservedHousesPerAgent="<<nrObservedHousesPerAgent;
    //cout << "\nnr types:"<< SoftPrintVector( this->GetNrTypes() ) << endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
        _m_allAgents.Insert(agI);
    ScatterHouses();
    ScatterAgents();
    AssignAgentActionsToHouses();
    AssignAgentTypesToHouses();

    //print summarization of assignment:
    cout << "-------------------"<<endl;
    cout << "Assignment summary:"<<endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        cout << "Agent "<<agI<<"...\n\tcan fight fire at houses:"<<
        SoftPrintVector(_m_houseIndices_action.at(agI)) <<
        "\n\tand can observe houses:" <<
        SoftPrintVector(_m_houseIndices_obs.at(agI)) << endl;
    }
#if DEBUGASSIGN
    for(Index hI=0; hI < _m_nrHouses; hI++)
    {
        cout << "House "<<hI<<"...\n\tcan be visited by agents :"<<
        _m_agentsForHouse_action.at(hI) <<
        "\n\tand by observed by agents:" <<
        _m_agentsForHouse_obs.at(hI) << endl;
    }
#endif
    cout << "-------------------"<<endl;


    //can we do an automatic reduction? I.e., when same scopes, the 
    //edges are combined ? 
    //Would that be something we would want? (perhaps not? the number of edges becomes variable)
    for(Index hI=0; hI < _m_nrHouses; hI++)
        AddEdge(hI);

}